

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execMove0<(moira::Instr)71,(moira::Mode)0,(moira::Size)2>(Moira *this,u16 opcode)

{
  bool bVar1;
  uint uVar2;
  ushort in_SI;
  u32 *in_RDI;
  int dst;
  int src;
  u32 data;
  u32 ea;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffec;
  undefined6 in_stack_fffffffffffffff0;
  
  uVar2 = (int)(uint)in_SI >> 9 & 7;
  bVar1 = readOp<(moira::Mode)0,(moira::Size)2,0ul>
                    ((Moira *)CONCAT26(in_SI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec,
                     (u32 *)(CONCAT44((int)(uint)in_SI >> 9,in_stack_ffffffffffffffe0) & 0x7ffffffff
                            ),in_RDI);
  if (bVar1) {
    bVar1 = NBIT<(moira::Size)2>((ulong)in_stack_ffffffffffffffec);
    *(bool *)((long)in_RDI + 0x5c9b) = bVar1;
    bVar1 = ZERO<(moira::Size)2>((ulong)in_stack_ffffffffffffffec);
    *(bool *)(in_RDI + 0x1727) = bVar1;
    *(undefined1 *)((long)in_RDI + 0x5c9d) = 0;
    *(undefined1 *)((long)in_RDI + 0x5c9e) = 0;
    bVar1 = writeOp<(moira::Mode)0,(moira::Size)2,0ul>
                      ((Moira *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),
                       (int)((ulong)in_RDI >> 0x20),(u32)in_RDI);
    if (bVar1) {
      prefetch<4ul>((Moira *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
    }
  }
  return;
}

Assistant:

void
Moira::execMove0(u16 opcode)
{
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp <M, S, STD_AE_FRAME> (src, ea, data)) return;

    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;

    if (!writeOp <MODE_DN, S> (dst, data)) return;

    prefetch<POLLIPL>();
}